

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_pack.c
# Opt level: O0

char * upack_str(char **buf)

{
  ck_uint32 cVar1;
  ulong __n;
  size_t strsz;
  char *val;
  char **buf_local;
  
  cVar1 = upack_int(buf);
  __n = (ulong)cVar1;
  if (__n == 0) {
    strsz = (size_t)emalloc(1);
    *(undefined1 *)strsz = 0;
  }
  else {
    strsz = (size_t)emalloc(__n + 1);
    memcpy((void *)strsz,*buf,__n);
    *(undefined1 *)(strsz + __n) = 0;
    *buf = *buf + __n;
  }
  return (char *)strsz;
}

Assistant:

static char *upack_str(char **buf)
{
    char *val;
    size_t strsz;

    strsz = (size_t) upack_int(buf);

    if(strsz > 0)
    {
        val = (char *)emalloc(strsz + 1);
        memcpy(val, *buf, strsz);
        val[strsz] = 0;
        *buf += strsz;
    }
    else
    {
        val = (char *)emalloc(1);
        *val = 0;
    }

    return val;
}